

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

bool __thiscall
ON_Layer::HasPerViewportSettings(ON_Layer *this,ON_UUID viewport_id,uint settings_mask)

{
  bool bVar1;
  uint uVar2;
  ON__LayerExtensions *pOVar3;
  ON__LayerPerViewSettings *this_00;
  undefined1 in_R9B;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  ON_UUID viewport_id_00;
  uchar *local_40;
  uchar local_38 [8];
  
  local_38 = viewport_id.Data4;
  local_40 = viewport_id._0_8_;
  if (settings_mask == 0) {
    return false;
  }
  bVar1 = ON_UuidIsNil((ON_UUID *)&local_40);
  if (!bVar1) {
    viewport_id_00.Data4[0] = '\0';
    viewport_id_00.Data4[1] = '\0';
    viewport_id_00.Data4[2] = '\0';
    viewport_id_00.Data4[3] = '\0';
    viewport_id_00.Data4[4] = '\0';
    viewport_id_00.Data4[5] = '\0';
    viewport_id_00.Data4[6] = '\0';
    viewport_id_00.Data4[7] = '\0';
    viewport_id_00._0_8_ = local_38;
    this_00 = ON__LayerExtensions::ViewportSettings
                        ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,local_40,
                         viewport_id_00,(bool)in_R9B);
    if (this_00 == (ON__LayerPerViewSettings *)0x0) {
      return false;
    }
    uVar2 = ON__LayerPerViewSettings::SettingsMask(this_00);
    if ((uVar2 & settings_mask) == 0) {
      return false;
    }
    return true;
  }
  bVar1 = false;
  pOVar3 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
  if (pOVar3 != (ON__LayerExtensions *)0x0) {
    uVar4 = (ulong)(pOVar3->m_vp_settings).m_count;
    bVar6 = 0 < (long)uVar4;
    if (0 < (long)uVar4) {
      uVar2 = ON__LayerPerViewSettings::SettingsMask((pOVar3->m_vp_settings).m_a);
      bVar1 = true;
      if ((uVar2 & settings_mask) == 0) {
        bVar1 = false;
        uVar5 = 0;
        do {
          uVar5 = uVar5 + 1;
          if (uVar5 == uVar4) goto LAB_004c7140;
          uVar2 = ON__LayerPerViewSettings::SettingsMask((pOVar3->m_vp_settings).m_a + uVar5);
        } while ((uVar2 & settings_mask) == 0);
        bVar1 = true;
LAB_004c7140:
        bVar6 = uVar5 < uVar4;
      }
    }
    if (bVar6) goto LAB_004c714f;
  }
  bVar1 = false;
LAB_004c714f:
  if (!bVar1) {
    return false;
  }
  return true;
}

Assistant:

bool ON_Layer::HasPerViewportSettings(
    ON_UUID viewport_id,
    unsigned int settings_mask
    ) const
{

  if ( 0 != settings_mask )
  {
    if ( ON_UuidIsNil(viewport_id) )
    {
      const ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
      if ( 0 != ud )
      {
        const int count = ud->m_vp_settings.Count();
        for ( int i = 0; i < count; i++ )
        {
          const ON__LayerPerViewSettings& s = ud->m_vp_settings[i];
          if ( 0 != (settings_mask & s.SettingsMask()) )
            return true;
        }
      }
    }
    else
    {
      const ON__LayerPerViewSettings* pvs = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, false );
      if ( 0 != pvs && 0 != (settings_mask & pvs->SettingsMask() ) )
        return true;
    }
  }

  return false;
}